

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O1

NondegeneracyCheckResult * __thiscall
slang::ast::SequenceConcatExpr::checkNondegeneracyImpl
          (NondegeneracyCheckResult *__return_storage_ptr__,SequenceConcatExpr *this)

{
  pointer pEVar1;
  uint32_t uVar2;
  SyntaxNode *pSVar3;
  SyntaxNode *pSVar4;
  bitmask<slang::ast::NondegeneracyStatus> bVar5;
  SourceLocation SVar6;
  pointer pEVar7;
  pointer pEVar8;
  bitmask<slang::ast::NondegeneracyStatus> bVar9;
  byte bVar10;
  bool bVar11;
  SourceRange SVar12;
  NondegeneracyCheckResult rightNondegen;
  NondegeneracyCheckResult leftNondegen;
  Token local_80;
  NondegeneracyCheckResult local_70;
  NondegeneracyCheckResult local_50;
  
  (__return_storage_ptr__->status).m_bits = 0;
  (__return_storage_ptr__->noMatchRange).startLoc = (SourceLocation)0x0;
  (__return_storage_ptr__->noMatchRange).endLoc = (SourceLocation)0x0;
  __return_storage_ptr__->isAlwaysFalse = false;
  pEVar8 = (this->elements)._M_ptr;
  AssertionExpr::checkNondegeneracy(&local_50,(pEVar8->sequence).ptr);
  uVar2 = (pEVar8->delay).min;
  bVar11 = (local_50.status.m_bits & 4) != 0;
  if (bVar11) {
    (__return_storage_ptr__->noMatchRange).startLoc = local_50.noMatchRange.startLoc;
    (__return_storage_ptr__->noMatchRange).endLoc = local_50.noMatchRange.endLoc;
    __return_storage_ptr__->isAlwaysFalse = local_50.isAlwaysFalse;
  }
  bVar10 = uVar2 == 0 & (byte)local_50.status.m_bits;
  bVar9.m_bits = local_50.status.m_bits;
  do {
    if ((bVar10 == 0) && (bVar11)) break;
    pEVar1 = pEVar8 + 1;
    pEVar7 = (this->elements)._M_ptr + (this->elements)._M_extent._M_extent_value;
    if (pEVar1 != pEVar7) {
      AssertionExpr::checkNondegeneracy(&local_70,pEVar8[1].sequence.ptr);
      bVar5.m_bits = local_70.status.m_bits;
      if ((local_70.status.m_bits & 4) != 0) {
        (__return_storage_ptr__->noMatchRange).startLoc = local_70.noMatchRange.startLoc;
        (__return_storage_ptr__->noMatchRange).endLoc = local_70.noMatchRange.endLoc;
        __return_storage_ptr__->isAlwaysFalse = local_70.isAlwaysFalse;
        bVar11 = true;
      }
      if ((local_70.status.m_bits & 1) == 0) {
        bVar10 = (byte)(local_70.status.m_bits & 1);
      }
      if ((((pEVar1->delay).min == 0) &&
          (pEVar8[1].delay.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_int>._M_engaged == true)) &&
         (pEVar8[1].delay.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload._M_value == 0)) {
        if (((pEVar8 == (this->elements)._M_ptr) && (!bVar11)) && ((bVar9.m_bits & 2) != 0)) {
          pSVar3 = ((pEVar8->sequence).ptr)->syntax;
          pSVar4 = (pEVar8[1].sequence.ptr)->syntax;
          bVar11 = true;
          if (pSVar4 != (SyntaxNode *)0x0 && pSVar3 != (SyntaxNode *)0x0) {
            local_80 = slang::syntax::SyntaxNode::getFirstToken(pSVar3);
            SVar6 = parsing::Token::location(&local_80);
            SVar12 = slang::syntax::SyntaxNode::sourceRange(pSVar4);
            (__return_storage_ptr__->noMatchRange).startLoc = SVar6;
            (__return_storage_ptr__->noMatchRange).endLoc = SVar12.endLoc;
            __return_storage_ptr__->isAlwaysFalse = false;
          }
        }
        bVar10 = 0;
        if (((bVar5.m_bits & 2) != 0) && (bVar10 = 0, !bVar11)) {
          pSVar3 = ((pEVar8->sequence).ptr)->syntax;
          pSVar4 = (pEVar8[1].sequence.ptr)->syntax;
          bVar11 = true;
          if (pSVar4 != (SyntaxNode *)0x0 && pSVar3 != (SyntaxNode *)0x0) {
            local_80 = slang::syntax::SyntaxNode::getFirstToken(pSVar3);
            SVar6 = parsing::Token::location(&local_80);
            SVar12 = slang::syntax::SyntaxNode::sourceRange(pSVar4);
            (__return_storage_ptr__->noMatchRange).startLoc = SVar6;
            (__return_storage_ptr__->noMatchRange).endLoc = SVar12.endLoc;
            __return_storage_ptr__->isAlwaysFalse = false;
          }
          bVar10 = 0;
        }
      }
      pEVar8 = pEVar1;
      bVar9.m_bits = bVar5.m_bits;
      if (1 < (pEVar1->delay).min) {
        bVar10 = 0;
      }
    }
  } while (pEVar1 != pEVar7);
  if (bVar10 != 0) {
    (__return_storage_ptr__->status).m_bits = 1;
  }
  if (bVar11) {
    *(byte *)&(__return_storage_ptr__->status).m_bits =
         (byte)(__return_storage_ptr__->status).m_bits | 4;
  }
  return __return_storage_ptr__;
}

Assistant:

static void enforceNondegeneracy(const AssertionExpr& expr, const ASTContext& context,
                                 AssertionExpr::NondegeneracyRequirement nondegRequirement,
                                 const SyntaxNode& syntax) {
    using NR = AssertionExpr::NondegeneracyRequirement;
    const auto seqNondegen = expr.checkNondegeneracy();
    const auto seqNondegenSt = seqNondegen.status;
    if (seqNondegenSt.has(NondegeneracyStatus::AdmitsNoMatch)) {
        auto range = seqNondegen.noMatchRange;
        if (!range.start())
            range = syntax.sourceRange();

        if (seqNondegen.isAlwaysFalse) {
            auto& diag = context.addDiag(diag::SeqNoMatch, syntax.sourceRange());
            diag.addNote(diag::NoteAlwaysFalse, range);
        }
        else {
            context.addDiag(diag::SeqNoMatch, range);
        }
    }
    else if (nondegRequirement == NR::OverlapOp) {
        if (seqNondegenSt.has(NondegeneracyStatus::AcceptsOnlyEmpty))
            context.addDiag(diag::SeqOnlyEmpty, syntax.sourceRange());
    }
    else if (nondegRequirement != NR::NonOverlapOp) {
        if (seqNondegenSt.has(NondegeneracyStatus::AdmitsEmpty))
            context.addDiag(diag::SeqEmptyMatch, syntax.sourceRange());
    }
}